

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::CubicSpline::apply_permutation
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,CubicSpline *this,
          vector<double,_std::allocator<double>_> *v,vector<int,_std::allocator<int>_> *p)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  size_type __n;
  allocator_type local_31;
  
  piVar1 = (p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar2 = (p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  __n = (long)piVar1 - (long)piVar2 >> 2;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_31);
  if (piVar1 != piVar2) {
    piVar1 = (p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      pdVar4[lVar5] = pdVar3[piVar1[lVar5]];
      lVar5 = lVar5 + 1;
    } while (__n + (__n == 0) != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> CubicSpline::apply_permutation(
      const std::vector<RealType>& v, const std::vector<int>& p) const {
    std::size_t n = p.size();
    std::vector<RealType> sorted_vec(n);

    for (std::size_t i = 0; i < n; ++i) {
      sorted_vec[i] = v[p[i]];
    }

    return sorted_vec;
  }